

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

QSqlField * __thiscall QList<QSqlField>::value(QList<QSqlField> *this,qsizetype i)

{
  QString *in_RDX;
  QMetaType in_RSI;
  QSqlField *in_RDI;
  long in_FS_OFFSET;
  QSqlField *this_00;
  QSqlField *defaultValue;
  QSqlField *this_01;
  QList<QSqlField> *this_02;
  undefined1 local_68 [24];
  QMetaType local_50;
  QList<QSqlField> local_48;
  QSqlField local_30;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_02 = &local_48;
  this_00 = in_RDI;
  QString::QString((QString *)0x13d35a);
  local_50.d_ptr = (QMetaTypeInterface *)0x0;
  QMetaType::QMetaType(&local_50);
  this_01 = (QSqlField *)local_68;
  QString::QString((QString *)0x13d37c);
  defaultValue = &local_30;
  QSqlField::QSqlField(this_01,(QString *)defaultValue,in_RSI,in_RDX);
  value(this_02,(qsizetype)this_01,defaultValue);
  QSqlField::~QSqlField(this_00);
  QString::~QString((QString *)0x13d3ca);
  QString::~QString((QString *)0x13d3d4);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

T value(qsizetype i) const { return value(i, T()); }